

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::MatchRoutineEM64T<wchar_t>::emit
               (X86Assembler *as,MyConstPool *pool,Label *rejectlabel,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str)

{
  ulong uVar1;
  CodeEmitter *pCVar2;
  CodeEmitter *pCVar3;
  undefined4 *puVar4;
  ulong uVar5;
  long lVar6;
  unsigned_long *puVar7;
  Data128 data;
  undefined4 in_stack_fffffffffffffcf8;
  uint32_t in_stack_fffffffffffffcfc;
  CodeEmitter *in_stack_fffffffffffffd00;
  MyConstPool *in_stack_fffffffffffffd08;
  MyConstPool *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  int o1;
  Operand_ *in_stack_fffffffffffffd20;
  Operand_ *o0;
  anon_union_8_2_78723da6_for_MemData_2 in_stack_fffffffffffffd28;
  uint32_t instId;
  CodeEmitter *in_stack_fffffffffffffd30;
  Imm local_2c8;
  Imm local_2b8;
  CodeHolder *local_2a8;
  int64_t local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [28];
  int j;
  Data128 d1;
  unsigned_long local_258;
  uint32_t local_250;
  uint32_t local_24c;
  int l1;
  int i_1;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_234;
  undefined8 uStack_230;
  int i;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str_local;
  Label *rejectlabel_local;
  MyConstPool *pool_local;
  X86Assembler *as_local;
  uint32_t signature_1;
  undefined4 local_204;
  size_t local_200;
  CodeEmitter *local_1f8;
  uint32_t local_1ec;
  size_t local_1e8;
  MyConstPool *local_1e0;
  undefined4 local_1d4;
  Gap *local_1d0;
  MyConstPool *local_1c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_1c0;
  MyConstPool *local_1b8;
  Gap *local_1b0;
  Gap *local_1a8;
  MyConstPool *local_1a0;
  undefined4 local_194;
  anon_union_16_7_ed616b9d_for_Operand__0 local_190;
  int *local_180;
  undefined8 local_178;
  MyConstPool *local_170;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_168;
  MyConstPool *local_160;
  undefined4 local_154;
  undefined8 local_150;
  int *local_148;
  undefined4 local_140;
  undefined4 local_13c;
  uint32_t signature;
  undefined4 local_134;
  undefined8 local_130;
  Operand_ *local_128;
  Imm *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  MyConstPool *local_108;
  Imm *local_100;
  undefined8 local_f8;
  MyConstPool *local_f0;
  undefined1 *local_e8;
  Operand_ *local_e0;
  undefined1 *local_d8;
  CodeEmitter *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  Operand_ *local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  CodeEmitter *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  CodeEmitter *local_90;
  undefined1 *local_88;
  Operand_ *local_80;
  undefined4 local_78;
  undefined4 local_74;
  CodeEmitter *local_70;
  undefined4 local_68;
  undefined4 local_64;
  Operand_ *local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint32_t local_c;
  
  uStack_230 = str;
  str_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              rejectlabel;
  rejectlabel_local = (Label *)pool;
  pool_local = (MyConstPool *)as;
  uVar1 = std::__cxx11::wstring::size();
  if (uVar1 < 8) {
    local_234 = 0;
    while( true ) {
      instId = in_stack_fffffffffffffd28.field_1.base;
      pCVar2 = (CodeEmitter *)(long)(int)local_234;
      pCVar3 = (CodeEmitter *)std::__cxx11::wstring::size();
      if (pCVar3 <= pCVar2) break;
      local_148 = &l1;
      local_150 = 0x22ee88;
      local_154 = 0;
      o0 = (Operand_ *)&l1;
      local_130 = 0x22ee88;
      local_134 = 0;
      signature = 2;
      local_13c = 0;
      local_e8 = &asmjit::NoInit;
      local_88 = &asmjit::NoInit;
      local_48 = 0x22ee88;
      local_20 = 0x22ee88;
      local_24 = 0x1f;
      local_28 = 3;
      local_140 = 0x2000030;
      local_c4 = 0x2000032;
      local_c8 = 0;
      local_68 = 0;
      local_58 = 0;
      _l1 = 1.65781168201985e-316;
      local_a8 = 0x22ee88;
      local_23c = 6;
      local_240 = 0;
      local_170 = pool_local;
      local_178 = 0x22ee28;
      local_180 = &l1;
      local_128 = o0;
      local_e0 = o0;
      local_c0 = o0;
      local_80 = o0;
      local_64 = local_c4;
      local_60 = o0;
      local_54 = local_c4;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd10,
                 (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffffd00,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_1c8 = pool_local;
      local_1d0 = (Gap *)(asmjit::x86OpData + 0x4e0);
      local_1d4 = 2;
      local_10 = 2;
      asmjit::CodeEmitter::emit(pCVar2,instId,o0,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      in_stack_fffffffffffffd28 = (anon_union_8_2_78723da6_for_MemData_2)pool_local;
      puVar4 = (undefined4 *)std::__cxx11::wstring::operator[](uStack_230);
      local_194 = *puVar4;
      local_190._packed[0].f64 = (UInt64)0x22ee28;
      local_190._8_8_ = in_stack_fffffffffffffd28;
      local_14 = local_194;
      asmjit::CodeEmitter::emit
                (pCVar2,in_stack_fffffffffffffd28.field_1.base,o0,
                 (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      local_1b8 = pool_local;
      local_1c0 = str_local;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,(Operand_ *)0x163a0a);
      local_234 = local_234 + 1;
    }
  }
  else {
    local_24c = 0;
    while( true ) {
      uVar1 = (ulong)(int)local_24c;
      uVar5 = std::__cxx11::wstring::size();
      if (uVar5 <= uVar1) break;
      lVar6 = std::__cxx11::wstring::size();
      local_258 = lVar6 - (int)local_24c;
      d1.sq[1] = 4;
      puVar7 = std::min<unsigned_long>(&local_258,(unsigned_long *)(d1.ub + 8));
      local_250 = (uint32_t)*puVar7;
      for (local_288._20_4_ = 0; o1 = (int)(uVar1 >> 0x20), (int)local_288._20_4_ < (int)local_250;
          local_288._20_4_ = local_288._20_4_ + 1) {
        puVar4 = (undefined4 *)std::__cxx11::wstring::operator[](uStack_230);
        *(short *)(local_288 + (long)(int)local_288._20_4_ * 2 + 0x18) = (short)*puVar4;
      }
      pCVar2 = (CodeEmitter *)local_288;
      local_200 = 0x22ee88;
      local_204 = 0;
      signature_1 = 0;
      as_local._4_4_ = 0;
      local_d8 = &asmjit::NoInit;
      local_98 = &asmjit::NoInit;
      local_40 = 0x22ee88;
      local_30 = 0x22ee88;
      local_34 = 0x1f;
      local_38 = 3;
      as_local._0_4_ = 0x30;
      local_b4 = 0x32;
      local_b8 = 0;
      local_78 = 0;
      local_50 = 0;
      local_288._0_8_ = (_func_int **)0x32;
      local_a0 = 0x22ee88;
      local_288._12_4_ = 6;
      local_288._8_4_ = 0;
      local_1a0 = pool_local;
      local_1a8 = (Gap *)(asmjit::x86OpData + 0x700);
      local_1b0 = (Gap *)local_288;
      local_1f8 = pCVar2;
      local_d0 = pCVar2;
      local_b0 = pCVar2;
      local_90 = pCVar2;
      local_74 = local_b4;
      local_70 = pCVar2;
      local_4c = local_b4;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd10,
                 (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_2a8 = stack0xfffffffffffffd90;
      local_2a0 = d1.sq[0];
      data.sq[1] = (int64_t)stack0xfffffffffffffd90;
      data.sq[0] = (int64_t)rejectlabel_local;
      in_stack_fffffffffffffd08 = pool_local;
      MyConstPool::add((MyConstPool *)local_298,data);
      asmjit::Imm::Imm(&local_2b8,0x19);
      local_110 = 0x22f0a8;
      local_118 = local_298;
      local_120 = &local_2b8;
      local_108 = in_stack_fffffffffffffd08;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd10,
                 (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (Operand_ *)0x163d56);
      in_stack_fffffffffffffd10 = pool_local;
      asmjit::Imm::Imm(&local_2c8,(long)(int)local_250);
      local_f8 = 0x22ee38;
      local_100 = &local_2c8;
      local_f0 = in_stack_fffffffffffffd10;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)in_stack_fffffffffffffd10,
                 (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),(Operand_ *)pCVar2,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_160 = pool_local;
      local_168 = str_local;
      asmjit::CodeEmitter::emit(pCVar2,in_stack_fffffffffffffcfc,(Operand_ *)0x163dfa);
      local_1e0 = pool_local;
      local_1e8 = 0x22ee88;
      local_1ec = local_250;
      local_c = local_250;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28.field_1.base,
                 in_stack_fffffffffffffd20,o1);
      local_24c = local_24c + 4;
    }
  }
  return;
}

Assistant:

void MatchRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, MyConstPool& pool, asmjit::Label& rejectlabel, const std::basic_string<TCHAR>& str)
{
    if (str.size() < 8)
    {
        for (int i = 0; i < str.size(); i++)
        {
            if (sizeof(TCHAR) == 1)
            {
                as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
                as.inc(INPUT_REG);
            }
            else
            {
                as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
                as.add(INPUT_REG, 2);
            }
            as.cmp(CHAR_REG, str[i]);
            as.jne(rejectlabel);
        }
    }
    else
    {
        for (int i = 0; i < str.size(); i += 16 / sizeof(TCHAR))
        {
            int l1 = std::min(str.size() - i, (size_t)(16 / sizeof(TCHAR)));

            asmjit::Data128 d1;

            for (int j = 0; j < l1; j++)
            {
                if (sizeof(TCHAR) == 1)
                    d1.ub[j] = str[i + j];
                else
                    d1.uw[j] = str[i + j];
            }

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(LOAD_REG, pool.add(d1), asmjit::Imm(sizeof(TCHAR) == 1 ? 0x18 : 0x19));
            as.cmp(INDEX_REG, asmjit::Imm(l1));
            as.jb(rejectlabel);
            as.add(INPUT_REG, l1);
        }
    }
}